

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O0

void __thiscall
ear::RegionHandler::RegionHandler(RegionHandler *this,VectorXi *outputChannels,MatrixXd *positions)

{
  MatrixXd *positions_local;
  VectorXi *outputChannels_local;
  RegionHandler *this_local;
  
  this->_vptr_RegionHandler = (_func_int **)&PTR___cxa_pure_virtual_003d7528;
  Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::Matrix(&this->_outputChannels,outputChannels);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->_positions,positions);
  return;
}

Assistant:

RegionHandler::RegionHandler(Eigen::VectorXi outputChannels,
                               Eigen::MatrixXd positions)
      : _outputChannels(outputChannels), _positions(positions){}